

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.h
# Opt level: O2

void __thiscall TcpServer::add_new_tcp_conn(TcpServer *this,TcpConnSP *tcp_conn)

{
  int iVar1;
  __shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  iVar1 = this->ts_tcp_conn_timout_ms;
  std::__shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&tcp_conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = Timer::
          run_after<TcpServer::add_new_tcp_conn(std::shared_ptr<TcpConnection>const&)::_lambda()_1_>
                    (&this->ts_timer,iVar1,false,(anon_class_16_1_33859248_for__M_f *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  ((tcp_conn->super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tc_timer_id =
       iVar1;
  std::vector<std::shared_ptr<TcpConnection>,std::allocator<std::shared_ptr<TcpConnection>>>::
  emplace_back<std::shared_ptr<TcpConnection>const&>
            ((vector<std::shared_ptr<TcpConnection>,std::allocator<std::shared_ptr<TcpConnection>>>
              *)&this->ts_tcp_connections,tcp_conn);
  return;
}

Assistant:

void add_new_tcp_conn(const TcpConnSP& tcp_conn) { 
        auto timer_id = ts_timer.run_after(ts_tcp_conn_timout_ms, false, [tcp_conn]{
LOG_INFO("tcp conn timeout!\n");
                            tcp_conn->active_close();
                        });
        tcp_conn->set_timer_id(timer_id);
        ts_tcp_connections.emplace_back(tcp_conn); 
    }